

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_matrix.cpp
# Opt level: O0

Reals __thiscall Omega_h::symms_inria2osh_dim<1>(Omega_h *this,Reals *symms)

{
  void *extraout_RDX;
  Reals RVar1;
  Write<double> local_e0;
  undefined1 local_d0 [8];
  type f;
  allocator local_99;
  string local_98 [32];
  undefined1 local_78 [8];
  Write<double> out;
  int n;
  Reals *symms_local;
  ulong local_20;
  ulong local_10;
  
  if (((ulong)(symms->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = ((symms->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(symms->write_).shared_alloc_.alloc >> 3;
  }
  out.shared_alloc_.direct_ptr._4_4_ = divide_no_remainder<int>((int)(local_10 >> 3),1);
  if (((ulong)(symms->write_).shared_alloc_.alloc & 1) == 0) {
    local_20 = ((symms->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_20 = (ulong)(symms->write_).shared_alloc_.alloc >> 3;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"",&local_99);
  Write<double>::Write((Write<double> *)local_78,(LO)(local_20 >> 3),(string *)local_98);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  Read<double>::Read((Read<double> *)local_d0,symms);
  Write<double>::Write
            ((Write<double> *)&f.symms.write_.shared_alloc_.direct_ptr,(Write<double> *)local_78);
  parallel_for<Omega_h::symms_inria2osh_dim<1>(Omega_h::Read<double>)::_lambda(int)_1_&>
            (out.shared_alloc_.direct_ptr._4_4_,(type *)local_d0);
  Write<double>::Write(&local_e0,(Write<signed_char> *)local_78);
  Read<double>::Read((Read<double> *)this,&local_e0);
  Write<double>::~Write(&local_e0);
  symms_inria2osh_dim<1>(Omega_h::Read<double>)::{lambda(int)#1}::~Read((_lambda_int__1_ *)local_d0)
  ;
  Write<double>::~Write((Write<double> *)local_78);
  RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar1.write_.shared_alloc_;
}

Assistant:

Reals symms_inria2osh_dim(Reals symms) {
  auto n = divide_no_remainder(symms.size(), symm_ncomps(dim));
  Write<Real> out(symms.size());
  auto f = OMEGA_H_LAMBDA(LO i) {
    auto iv = get_vector<symm_ncomps(dim)>(symms, i);
    auto is = vector2symm_inria(iv);
    auto ov = symm2vector(is);
    set_vector(out, i, ov);
  };
  parallel_for(n, f);
  return out;
}